

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heartbeat_message_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::pixie::HeartbeatMessageTest_test_equals_similar_Test::TestBody
          (HeartbeatMessageTest_test_equals_similar_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_50;
  Message local_48 [3];
  undefined1 local_30 [8];
  AssertionResult gtest_ar;
  HeartbeatMessage message2;
  HeartbeatMessage message1;
  HeartbeatMessageTest_test_equals_similar_Test *this_local;
  
  bidfx_public_api::price::pixie::HeartbeatMessage::HeartbeatMessage(&message2);
  bidfx_public_api::price::pixie::HeartbeatMessage::HeartbeatMessage
            ((HeartbeatMessage *)&gtest_ar.message_);
  testing::internal::EqHelper<false>::
  Compare<bidfx_public_api::price::pixie::HeartbeatMessage,bidfx_public_api::price::pixie::HeartbeatMessage>
            ((EqHelper<false> *)local_30,"message1","message2",&message2,
             (HeartbeatMessage *)&gtest_ar.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar1) {
    testing::Message::Message(local_48);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_30);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/heartbeat_message_test.cpp"
               ,0x38,message);
    testing::internal::AssertHelper::operator=(&local_50,local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message(local_48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  return;
}

Assistant:

TEST(HeartbeatMessageTest, test_equals_similar)
{
    HeartbeatMessage message1;
    HeartbeatMessage message2;
    EXPECT_EQ(message1, message2);
}